

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNode * __thiscall Parser::sub(Parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  undefined1 local_158 [8];
  Token closeBrace;
  ExprNode *subTest;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_80 [8];
  Token openBrace;
  Parser *this_local;
  
  openBrace._string.field_2._8_8_ = this;
  Tokenizer::getToken((Token *)local_80,this->tokenizer);
  bVar2 = Token::isOpenBrace((Token *)local_80);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Parser::sub",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Expected an [ sign, instead got",
               (allocator<char> *)((long)&subTest + 7));
    die(this,&local_b0,&local_d8,(Token *)local_80);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&subTest + 7));
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  closeBrace._string.field_2._8_8_ = test(this);
  Tokenizer::getToken((Token *)local_158,this->tokenizer);
  bVar2 = Token::isCloseBrace((Token *)local_158);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Parser::sub",&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Expected an ] sign, instead got",&local_1a1);
    die(this,&local_178,&local_1a0,(Token *)local_158);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  uVar1 = closeBrace._string.field_2._8_8_;
  Token::~Token((Token *)local_158);
  Token::~Token((Token *)local_80);
  return (ExprNode *)uVar1;
}

Assistant:

ExprNode *Parser::sub() {
    Token openBrace = tokenizer.getToken();
    if (!openBrace.isOpenBrace())
        die("Parser::sub", "Expected an [ sign, instead got", openBrace);
    ExprNode *subTest = test();
    Token closeBrace = tokenizer.getToken();
    if (!closeBrace.isCloseBrace())
        die("Parser::sub", "Expected an ] sign, instead got", closeBrace);
    return subTest;

}